

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_parse_ini_file(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_io_stream *pStream_00;
  int local_7c;
  int local_64;
  void *pvStack_60;
  int nLen;
  void *pHandle;
  SyBlob sContents;
  char *zFile;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting a file path");
    jx9_result_bool(pCtx,0);
    return 0;
  }
  sContents._24_8_ = jx9_value_to_string(*apArg,&local_64);
  pStream_00 = jx9VmGetStreamDevice(pCtx->pVm,(char **)&sContents.nFlags,local_64);
  if (pStream_00 == (jx9_io_stream *)0x0) {
    jx9_context_throw_error(pCtx,2,"No such stream device, JX9 is returning FALSE");
    jx9_result_bool(pCtx,0);
    return 0;
  }
  pvStack_60 = jx9StreamOpenHandle(pCtx->pVm,pStream_00,(char *)sContents._24_8_,1,0,
                                   (jx9_value *)0x0,0,(int *)0x0);
  if (pvStack_60 == (void *)0x0) {
    jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",sContents._24_8_);
    jx9_result_bool(pCtx,0);
    return 0;
  }
  SyBlobInit((SyBlob *)&pHandle,&pCtx->pVm->sAllocator);
  jx9StreamReadWholeFile(pvStack_60,pStream_00,(SyBlob *)&pHandle);
  if ((sxu32)sContents.pBlob == 0) {
    jx9_result_bool(pCtx,0);
  }
  else {
    if (nArg < 2) {
      local_7c = 0;
    }
    else {
      local_7c = jx9_value_to_bool(apArg[1]);
    }
    jx9ParseIniString(pCtx,(char *)sContents.pAllocator,(sxu32)sContents.pBlob,local_7c);
  }
  jx9StreamCloseHandle(pStream_00,pvStack_60);
  SyBlobRelease((SyBlob *)&pHandle);
  return 0;
}

Assistant:

static int jx9Builtin_parse_ini_file(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zFile;
	SyBlob sContents;
	void *pHandle;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, FALSE, 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	SyBlobInit(&sContents, &pCtx->pVm->sAllocator);
	/* Read the whole file */
	jx9StreamReadWholeFile(pHandle, pStream, &sContents);
	if( SyBlobLength(&sContents) < 1 ){
		/* Empty buffer, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Process the raw INI buffer */
		jx9ParseIniString(pCtx, (const char *)SyBlobData(&sContents), SyBlobLength(&sContents), 
			nArg > 1 ? jx9_value_to_bool(apArg[1]) : 0);
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Release the working buffer */
	SyBlobRelease(&sContents);
	return JX9_OK;
}